

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int uv__async_start(uv_loop_t *loop)

{
  uint uVar1;
  char local_48 [4];
  int fd;
  char buf [32];
  uint local_20;
  int err;
  int pipefd [2];
  uv_loop_t *loop_local;
  
  if ((loop->async_io_watcher).fd == -1) {
    pipefd = (int  [2])loop;
    buf._28_4_ = uv__async_eventfd();
    if ((int)buf._28_4_ < 0) {
      if ((buf._28_4_ == 0xffffffda) &&
         (buf._28_4_ = uv__make_pipe((int *)&local_20,0x800), buf._28_4_ == 0)) {
        snprintf(local_48,0x20,"/proc/self/fd/%d",(ulong)local_20);
        uVar1 = uv__open_cloexec(local_48,2);
        if (-1 < (int)uVar1) {
          uv__close(local_20);
          uv__close(err);
          local_20 = uVar1;
          err = uVar1;
        }
      }
    }
    else {
      err = -1;
      local_20 = buf._28_4_;
    }
    if ((int)buf._28_4_ < 0) {
      loop_local._4_1_ = buf[0x1c];
      loop_local._5_1_ = buf[0x1d];
      loop_local._6_1_ = buf[0x1e];
      loop_local._7_1_ = buf[0x1f];
    }
    else {
      uv__io_init((uv__io_t *)((long)pipefd + 0x1d0),uv__async_io,local_20);
      uv__io_start((uv_loop_t *)pipefd,(uv__io_t *)((long)pipefd + 0x1d0),1);
      *(int *)((long)pipefd + 0x208) = err;
      loop_local._4_4_ = 0;
    }
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__async_start(uv_loop_t* loop) {
  int pipefd[2];
  int err;

  if (loop->async_io_watcher.fd != -1)
    return 0;

  err = uv__async_eventfd();
  if (err >= 0) {
    pipefd[0] = err;
    pipefd[1] = -1;
  }
  else if (err == UV_ENOSYS) {
    err = uv__make_pipe(pipefd, UV__F_NONBLOCK);
#if defined(__linux__)
    /* Save a file descriptor by opening one of the pipe descriptors as
     * read/write through the procfs.  That file descriptor can then
     * function as both ends of the pipe.
     */
    if (err == 0) {
      char buf[32];
      int fd;

      snprintf(buf, sizeof(buf), "/proc/self/fd/%d", pipefd[0]);
      fd = uv__open_cloexec(buf, O_RDWR);
      if (fd >= 0) {
        uv__close(pipefd[0]);
        uv__close(pipefd[1]);
        pipefd[0] = fd;
        pipefd[1] = fd;
      }
    }
#endif
  }

  if (err < 0)
    return err;

  uv__io_init(&loop->async_io_watcher, uv__async_io, pipefd[0]);
  uv__io_start(loop, &loop->async_io_watcher, POLLIN);
  loop->async_wfd = pipefd[1];

  return 0;
}